

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityStateUpdatePdu.cpp
# Opt level: O2

void __thiscall DIS::EntityStateUpdatePdu::EntityStateUpdatePdu(EntityStateUpdatePdu *this)

{
  EntityInformationFamilyPdu::EntityInformationFamilyPdu(&this->super_EntityInformationFamilyPdu);
  (this->super_EntityInformationFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__EntityStateUpdatePdu_001b0df0;
  EntityID::EntityID(&this->_entityID);
  this->_padding1 = '\0';
  this->_numberOfArticulationParameters = '\0';
  Vector3Float::Vector3Float(&this->_entityLinearVelocity);
  Vector3Double::Vector3Double(&this->_entityLocation);
  Orientation::Orientation(&this->_entityOrientation);
  this->_entityAppearance = 0;
  (this->_articulationParameters).
  super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_articulationParameters).
  super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_articulationParameters).
  super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Pdu::setPduType((Pdu *)this,'C');
  Pdu::setProtocolFamily((Pdu *)this,'\x01');
  return;
}

Assistant:

EntityStateUpdatePdu::EntityStateUpdatePdu() : EntityInformationFamilyPdu(),
   _entityID(), 
   _padding1(0), 
   _numberOfArticulationParameters(0), 
   _entityLinearVelocity(), 
   _entityLocation(), 
   _entityOrientation(), 
   _entityAppearance(0)
{
    setPduType( 67 );
    setProtocolFamily( 1 );
}